

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlDOMWrapNSNormAcquireNormalizedNs
              (xmlDocPtr doc,xmlNodePtr elem,xmlNsPtr ns,xmlNsPtr *retNs,xmlNsMapPtr *nsMap,
              int depth,int ancestorsOnly,int prefixed)

{
  int iVar1;
  xmlNsPtr pxVar2;
  xmlNsMapItemPtr_conflict pxVar3;
  xmlNsPtr tmpns_1;
  xmlNsPtr tmpns;
  xmlNsMapItemPtr_conflict mi;
  int depth_local;
  xmlNsMapPtr *nsMap_local;
  xmlNsPtr *retNs_local;
  xmlNsPtr ns_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  
  if ((((doc == (xmlDocPtr)0x0) || (ns == (xmlNsPtr)0x0)) || (retNs == (xmlNsPtr *)0x0)) ||
     (nsMap == (xmlNsMapPtr *)0x0)) {
    doc_local._4_4_ = -1;
  }
  else {
    *retNs = (xmlNsPtr)0x0;
    if (((ns->prefix == (xmlChar *)0x0) || (*ns->prefix != 'x')) ||
       ((ns->prefix[1] != 'm' || ((ns->prefix[2] != 'l' || (ns->prefix[3] != '\0')))))) {
      if ((*nsMap != (xmlNsMapPtr)0x0) &&
         (((*nsMap)->first != (xmlNsMapItemPtr_conflict)0x0 &&
          ((ancestorsOnly == 0 || (elem != (xmlNodePtr)0x0)))))) {
        for (tmpns = (xmlNsPtr)(*nsMap)->first; tmpns != (xmlNsPtr)0x0; tmpns = tmpns->next) {
          if (((((-2 < *(int *)((long)&tmpns->_private + 4)) &&
                (((ancestorsOnly == 0 || (*(int *)((long)&tmpns->_private + 4) == -1)) &&
                 (*(int *)&tmpns->_private == -1)))) &&
               ((*(long *)(tmpns->prefix + 0x10) != 0 && (**(char **)(tmpns->prefix + 0x10) != '\0')
                ))) && ((prefixed == 0 || (*(long *)(tmpns->prefix + 0x18) != 0)))) &&
             ((*(xmlChar **)(tmpns->prefix + 0x10) == ns->href ||
              (iVar1 = xmlStrEqual(*(xmlChar **)(tmpns->prefix + 0x10),ns->href), iVar1 != 0)))) {
            tmpns->href = (xmlChar *)ns;
            *retNs = (xmlNsPtr)tmpns->prefix;
            return 0;
          }
        }
      }
      if (elem == (xmlNodePtr)0x0) {
        pxVar2 = xmlDOMWrapStoreNs(doc,ns->href,ns->prefix);
        if (pxVar2 == (xmlNsPtr)0x0) {
          return -1;
        }
        pxVar3 = xmlDOMWrapNsMapAddItem(nsMap,-1,ns,pxVar2,-3);
        if (pxVar3 == (xmlNsMapItemPtr_conflict)0x0) {
          return -1;
        }
        *retNs = pxVar2;
      }
      else {
        pxVar2 = xmlDOMWrapNSNormDeclareNsForced(doc,elem,ns->href,ns->prefix,0);
        if (pxVar2 == (xmlNsPtr)0x0) {
          return -1;
        }
        if (*nsMap != (xmlNsMapPtr)0x0) {
          for (tmpns = (xmlNsPtr)(*nsMap)->first; tmpns != (xmlNsPtr)0x0; tmpns = tmpns->next) {
            if (((*(int *)((long)&tmpns->_private + 4) < depth) && (*(int *)&tmpns->_private == -1))
               && ((ns->prefix == *(xmlChar **)(tmpns->prefix + 0x18) ||
                   (iVar1 = xmlStrEqual(ns->prefix,*(xmlChar **)(tmpns->prefix + 0x18)), iVar1 != 0)
                   ))) {
              *(int *)&tmpns->_private = depth;
              break;
            }
          }
        }
        pxVar3 = xmlDOMWrapNsMapAddItem(nsMap,-1,ns,pxVar2,depth);
        if (pxVar3 == (xmlNsMapItemPtr_conflict)0x0) {
          return -1;
        }
        *retNs = pxVar2;
      }
      doc_local._4_4_ = 0;
    }
    else {
      pxVar2 = xmlTreeEnsureXMLDecl(doc);
      *retNs = pxVar2;
      if (*retNs == (xmlNsPtr)0x0) {
        doc_local._4_4_ = -1;
      }
      else {
        doc_local._4_4_ = 0;
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

static int
xmlDOMWrapNSNormAcquireNormalizedNs(xmlDocPtr doc,
				   xmlNodePtr elem,
				   xmlNsPtr ns,
				   xmlNsPtr *retNs,
				   xmlNsMapPtr *nsMap,

				   int depth,
				   int ancestorsOnly,
				   int prefixed)
{
    xmlNsMapItemPtr mi;

    if ((doc == NULL) || (ns == NULL) || (retNs == NULL) ||
	(nsMap == NULL))
	return (-1);

    *retNs = NULL;
    /*
    * Handle XML namespace.
    */
    if (IS_STR_XML(ns->prefix)) {
	/*
	* Insert XML namespace mapping.
	*/
	*retNs = xmlTreeEnsureXMLDecl(doc);
	if (*retNs == NULL)
	    return (-1);
	return (0);
    }
    /*
    * If the search should be done in ancestors only and no
    * @elem (the first ancestor) was specified, then skip the search.
    */
    if ((XML_NSMAP_NOTEMPTY(*nsMap)) &&
	(! (ancestorsOnly && (elem == NULL))))
    {
	/*
	* Try to find an equal ns-name in in-scope ns-decls.
	*/
	XML_NSMAP_FOREACH(*nsMap, mi) {
	    if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
		/*
		* ancestorsOnly: This should be turned on to gain speed,
		* if one knows that the branch itself was already
		* ns-wellformed and no stale references existed.
		* I.e. it searches in the ancestor axis only.
		*/
		((! ancestorsOnly) || (mi->depth == XML_TREE_NSMAP_PARENT)) &&
		/* Skip shadowed prefixes. */
		(mi->shadowDepth == -1) &&
		/* Skip xmlns="" or xmlns:foo="". */
		((mi->newNs->href != NULL) &&
		(mi->newNs->href[0] != 0)) &&
		/* Ensure a prefix if wanted. */
		((! prefixed) || (mi->newNs->prefix != NULL)) &&
		/* Equal ns name */
		((mi->newNs->href == ns->href) ||
		xmlStrEqual(mi->newNs->href, ns->href))) {
		/* Set the mapping. */
		mi->oldNs = ns;
		*retNs = mi->newNs;
		return (0);
	    }
	}
    }
    /*
    * No luck, the namespace is out of scope or shadowed.
    */
    if (elem == NULL) {
	xmlNsPtr tmpns;

	/*
	* Store ns-decls in "oldNs" of the document-node.
	*/
	tmpns = xmlDOMWrapStoreNs(doc, ns->href, ns->prefix);
	if (tmpns == NULL)
	    return (-1);
	/*
	* Insert mapping.
	*/
	if (xmlDOMWrapNsMapAddItem(nsMap, -1, ns,
		tmpns, XML_TREE_NSMAP_DOC) == NULL) {
	    return (-1);
	}
	*retNs = tmpns;
    } else {
	xmlNsPtr tmpns;

	tmpns = xmlDOMWrapNSNormDeclareNsForced(doc, elem, ns->href,
	    ns->prefix, 0);
	if (tmpns == NULL)
	    return (-1);

	if (*nsMap != NULL) {
	    /*
	    * Does it shadow ancestor ns-decls?
	    */
	    XML_NSMAP_FOREACH(*nsMap, mi) {
		if ((mi->depth < depth) &&
		    (mi->shadowDepth == -1) &&
		    ((ns->prefix == mi->newNs->prefix) ||
		    xmlStrEqual(ns->prefix, mi->newNs->prefix))) {
		    /*
		    * Shadows.
		    */
		    mi->shadowDepth = depth;
		    break;
		}
	    }
	}
	if (xmlDOMWrapNsMapAddItem(nsMap, -1, ns, tmpns, depth) == NULL) {
	    return (-1);
	}
	*retNs = tmpns;
    }
    return (0);
}